

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

uint64_t buffer_bookmark_pop(buffer_t *buffer,int width,int height,int *error)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = buffer->bookmarks_head;
  if (-1 < (long)iVar1) {
    buffer->bookmarks_head = iVar1 + -1;
    uVar2 = buffer->bookmarks[iVar1];
    *error = 0;
    uVar2 = buffer_scroll(buffer,uVar2,width,height);
    return uVar2;
  }
  *error = 1;
  return 0;
}

Assistant:

uint64_t
buffer_bookmark_pop(buffer_t *buffer, int width, int height, int *error)
{
    if (buffer->bookmarks_head >= 0) {
        uintptr_t address = buffer->bookmarks[buffer->bookmarks_head--];
        *error = 0;
        return buffer_scroll(buffer, address, width, height);
    }

    *error = 1;
    return 0;
}